

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adjacency_subgraph.hpp
# Opt level: O2

size_t __thiscall Disa::Adjacency_Subgraph::local_global(Adjacency_Subgraph *this,size_t *i_vertex)

{
  long lVar1;
  ostream *poVar2;
  source_location *location;
  string local_100;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined **local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  location = (source_location *)
             (this->graph).offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
  lVar1 = (long)(this->graph).offset.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)location;
  if ((lVar1 != 0) &&
     (location = (source_location *)*i_vertex, location < (source_location *)((lVar1 >> 3) - 1U))) {
    return (this->i_local_global).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start[(long)location];
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"\n");
  local_40 = &PTR_s__workspace_llm4binary_github_lic_00155720;
  console_format_abi_cxx11_(&local_38,(Disa *)0x0,(Log_Level)&local_40,location);
  poVar2 = std::operator<<(poVar2,(string *)&local_38);
  std::__cxx11::to_string(&local_e0,*i_vertex);
  std::operator+(&local_c0,"Local vertex index ",&local_e0);
  std::operator+(&local_a0,&local_c0," not in range [0, ");
  std::__cxx11::to_string(&local_100,*i_vertex);
  std::operator+(&local_80,&local_a0,&local_100);
  std::operator+(&local_60,&local_80,").");
  poVar2 = std::operator<<(poVar2,(string *)&local_60);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_38);
  exit(1);
}

Assistant:

[[nodiscard]] inline std::size_t local_global(const std::size_t& i_vertex) const {
    ASSERT_DEBUG(i_vertex < size_vertex(), "Local vertex index " + std::to_string(i_vertex) + " not in range [0, " +
                                           std::to_string(i_vertex) + ").");
    return i_local_global[i_vertex];
  }